

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_thread.c
# Opt level: O1

int nni_plat_cv_until(nni_plat_cv *cv,nni_time until)

{
  int __errnum;
  char *pcVar1;
  undefined1 local_18 [8];
  timespec ts;
  
  local_18 = (undefined1  [8])(until / 1000);
  ts.tv_sec = (until % 1000) * 1000000;
  __errnum = pthread_cond_timedwait
                       ((pthread_cond_t *)cv,(pthread_mutex_t *)cv->mtx,(timespec *)local_18);
  if (__errnum != 0) {
    if ((__errnum == 0x6e) || (__errnum == 0xb)) {
      __errnum = 5;
    }
    else {
      pcVar1 = strerror(__errnum);
      nni_panic("pthread_cond_timedwait: %s",pcVar1);
      __errnum = 3;
    }
  }
  return __errnum;
}

Assistant:

int
nni_plat_cv_until(nni_plat_cv *cv, nni_time until)
{
	struct timespec ts;

	// Our caller has already guaranteed a sane value for until.
	ts.tv_sec  = until / 1000;
	ts.tv_nsec = (until % 1000) * 1000000;

	return (nni_pthread_cond_timedwait(&cv->cv, cv->mtx, &ts));
}